

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

QDebug operator<<(QDebug *debug,QDir *dir)

{
  QFlagsStorage<QDir::Filter> QVar1;
  QDebug *pQVar2;
  char *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QDebug *in_stack_00000030;
  SortFlags in_stack_000000ec;
  QDebugStateSaver save;
  QFlagsStorage<QDir::Filter> in_stack_0000027c;
  char in_stack_fffffffffffffeef;
  QDebugStateSaver *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  QDebug *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined2 in_stack_ffffffffffffff0c;
  QChar in_stack_ffffffffffffff0e;
  QDebugStateSaver *in_stack_ffffffffffffff10;
  QDebug *in_stack_ffffffffffffff18;
  Stream *this;
  QChar local_7a [37];
  QDebug local_30;
  QDebug *in_stack_ffffffffffffffd8;
  QDebug local_20 [2];
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  this = in_RDI;
  QDebugStateSaver::QDebugStateSaver
            (in_stack_ffffffffffffff10,
             (QDebug *)
             CONCAT26(in_stack_ffffffffffffff0e.ucs,
                      CONCAT24(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)));
  QDebug::resetFormat((QDebug *)in_stack_fffffffffffffef0);
  QDebug::operator<<(in_stack_ffffffffffffff18,in_RSI);
  QDir::path((QDir *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  QDebug::operator<<(in_stack_ffffffffffffff00,
                     (QString *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  QDebug::operator<<(in_stack_ffffffffffffff18,in_RSI);
  QDir::nameFilters((QDir *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  QChar::QChar<char16_t,_true>(local_7a,L',');
  QListSpecialMethods<QString>::join
            ((QListSpecialMethods<QString> *)
             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),in_stack_ffffffffffffff0e
            );
  pQVar2 = QDebug::operator<<(in_stack_ffffffffffffff00,
                              (QString *)
                              CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  pQVar2 = QDebug::operator<<(pQVar2,in_RSI);
  QDebug::QDebug(&local_30,pQVar2);
  QDir::sorting((QDir *)in_stack_fffffffffffffef0);
  operator<<(in_stack_ffffffffffffffd8,in_stack_000000ec);
  pQVar2 = QDebug::operator<<((QDebug *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeef);
  QDebug::QDebug(local_20,pQVar2);
  QVar1.i = (Int)QDir::filter((QDir *)in_stack_fffffffffffffef0);
  operator<<(in_stack_00000030,(Filters)in_stack_0000027c.i);
  QDebug::operator<<((QDebug *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeef);
  QDebug::~QDebug((QDebug *)this);
  QDebug::~QDebug((QDebug *)this);
  QDebug::~QDebug((QDebug *)this);
  QDebug::~QDebug((QDebug *)this);
  QString::~QString((QString *)0x28431c);
  QList<QString>::~QList((QList<QString> *)0x284329);
  QString::~QString((QString *)0x284336);
  QDebug::QDebug(pQVar2,(QDebug *)CONCAT44(QVar1.i,in_stack_fffffffffffffef8));
  QDebugStateSaver::~QDebugStateSaver(in_stack_fffffffffffffef0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDebug)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, const QDir &dir)
{
    QDebugStateSaver save(debug);
    debug.resetFormat();
    debug << "QDir(" << dir.path() << ", nameFilters = {"
          << dir.nameFilters().join(u',')
          << "}, "
          << dir.sorting()
          << ','
          << dir.filter()
          << ')';
    return debug;
}